

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricGroupCreateExpPrologue
          (ZETParameterValidation *this,zet_device_handle_t hDevice,char *pName,char *pDescription,
          zet_metric_group_sampling_type_flags_t samplingType,
          zet_metric_group_handle_t *phMetricGroup)

{
  ze_result_t zVar1;
  
  if (hDevice != (zet_device_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((phMetricGroup != (zet_metric_group_handle_t *)0x0 &&
         (pDescription != (char *)0x0 && pName != (char *)0x0)) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, samplingType < 8)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricGroupCreateExpPrologue(
        zet_device_handle_t hDevice,                    ///< [in] handle of the device
        const char* pName,                              ///< [in] pointer to metric group name. Must point to a null-terminated
                                                        ///< character array no longer than ::ZET_MAX_METRIC_GROUP_NAME.
        const char* pDescription,                       ///< [in] pointer to metric group description. Must point to a
                                                        ///< null-terminated character array no longer than
                                                        ///< ::ZET_MAX_METRIC_GROUP_DESCRIPTION.
        zet_metric_group_sampling_type_flags_t samplingType,///< [in] Sampling type for the metric group.
        zet_metric_group_handle_t* phMetricGroup        ///< [in,out] Created Metric group handle
        )
    {
        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == pName )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pDescription )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phMetricGroup )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x7 < samplingType )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ZE_RESULT_SUCCESS;
    }